

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,uint32_t group,uint32_t workId,uint32_t physId,
          uint32_t allocableRegs)

{
  byte bVar1;
  RAWorkReg *pRVar2;
  uint32_t uVar3;
  
  if (allocableRegs != 0) {
    pRVar2 = workRegById(this,workId);
    bVar1 = pRVar2->_homeRegId;
    uVar3 = (uint32_t)bVar1;
    if ((1 << (bVar1 & 0x1f) & allocableRegs) == 0) {
      uVar3 = 0xff;
    }
    if (bVar1 == 0xff) {
      uVar3 = 0xff;
    }
    return uVar3;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
             ,0x3e6,"allocableRegs != 0");
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(uint32_t group, uint32_t workId, uint32_t physId, uint32_t allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer allocating back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId()))
      return workReg->homeRegId();
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}